

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChKblockGeneric.cpp
# Opt level: O2

void __thiscall
chrono::ChKblockGeneric::ChKblockGeneric
          (ChKblockGeneric *this,
          vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> *mvariables)

{
  _Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> local_30;
  
  (this->super_ChKblock)._vptr_ChKblock = (_func_int **)&PTR__ChKblockGeneric_01186748;
  (this->K).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  (this->K).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows = 0;
  (this->K).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols = 0;
  (this->variables).
  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->K).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols = 0;
  (this->variables).
  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->variables).
  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->variables).
  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>::vector
            ((vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> *)&local_30,
             mvariables);
  SetVariables(this,(vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> *)
                    &local_30);
  std::_Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>::~_Vector_base
            (&local_30);
  return;
}

Assistant:

ChKblockGeneric::ChKblockGeneric(std::vector<ChVariables*> mvariables) {
    SetVariables(mvariables);
}